

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O0

void __thiscall llvm::FoldingSetBase::reserve(FoldingSetBase *this,uint EltCount)

{
  uint uVar1;
  uint64_t uVar2;
  uint EltCount_local;
  FoldingSetBase *this_local;
  
  uVar1 = capacity(this);
  if (uVar1 <= EltCount) {
    uVar2 = PowerOf2Floor((ulong)EltCount);
    GrowBucketCount(this,(uint)uVar2);
  }
  return;
}

Assistant:

void FoldingSetBase::reserve(unsigned EltCount) {
  // This will give us somewhere between EltCount / 2 and
  // EltCount buckets.  This puts us in the load factor
  // range of 1.0 - 2.0.
  if(EltCount < capacity())
    return;
  GrowBucketCount(PowerOf2Floor(EltCount));
}